

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O3

bool wasm::ParamUtils::removeParameter
               (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *funcs,Index index,
               vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
               vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *callRefs,Module *module,
               PassRunner *runner)

{
  Function *pFVar1;
  Call **ppCVar2;
  CallRef **ppCVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  undefined1 auVar6 [16];
  PassRunner *pPVar7;
  bool bVar8;
  pointer ppFVar9;
  Type TVar10;
  TaskFunc p_Var11;
  __normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
  __it;
  __normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
  __it_00;
  pointer ppCVar12;
  pointer ppCVar13;
  pointer __src;
  long lVar14;
  long lVar15;
  pointer ppFVar16;
  __normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
  _Var17;
  __normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
  _Var18;
  ulong uVar19;
  Signature SVar20;
  Iterator __first;
  Iterator start_it;
  Iterator start_it_00;
  Iterator __last;
  Iterator end_it;
  Iterator end_it_00;
  LocalUpdater local_1b8;
  Type local_d8;
  Type paramsType;
  PassRunner *runner_local;
  HeapType *local_c0;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *local_b8;
  undefined1 local_b0 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  Module *module_local;
  Type *local_88;
  anon_class_24_3_97fb837d hasBadEffects;
  undefined1 auStack_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> newIndexes;
  Index index_local;
  
  ppFVar9 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  ppFVar16 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  paramsType.id = (uintptr_t)runner;
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)module;
  newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = index;
  if (ppFVar16 == ppFVar9) {
    __assert_fail("funcs.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                  ,0x36,
                  "bool wasm::ParamUtils::removeParameter(const std::vector<Function *> &, Index, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *, PassRunner *)"
                 );
  }
  pFVar1 = *ppFVar9;
  local_c0 = &pFVar1->type;
  do {
    if (((*ppFVar9)->type).id != (pFVar1->type).id) {
      __assert_fail("func->type == first->type",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                    ,0x3a,
                    "bool wasm::ParamUtils::removeParameter(const std::vector<Function *> &, Index, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *, PassRunner *)"
                   );
    }
    ppFVar9 = ppFVar9 + 1;
  } while (ppFVar9 != ppFVar16);
  local_88 = &paramsType;
  hasBadEffects.runner =
       (PassRunner **)
       &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  hasBadEffects.module =
       (Module **)
       ((long)&newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4);
  __it._M_current =
       (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
       super__Vector_impl_data._M_start;
  ppCVar2 = (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  lVar15 = (long)ppCVar2 - (long)__it._M_current;
  local_b8 = calls;
  if (0 < lVar15 >> 5) {
    lVar14 = (lVar15 >> 5) + 1;
    do {
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
              ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                            *)&local_88,__it);
      _Var17._M_current = __it._M_current;
      if (bVar8) goto LAB_0061a1dd;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
              ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                            *)&local_88,
                           (__normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                            )(__it._M_current + 1));
      _Var17._M_current = __it._M_current + 1;
      if (bVar8) goto LAB_0061a1dd;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
              ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                            *)&local_88,
                           (__normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                            )(__it._M_current + 2));
      _Var17._M_current = __it._M_current + 2;
      if (bVar8) goto LAB_0061a1dd;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
              ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                            *)&local_88,
                           (__normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                            )(__it._M_current + 3));
      _Var17._M_current = __it._M_current + 3;
      if (bVar8) goto LAB_0061a1dd;
      __it._M_current = __it._M_current + 4;
      lVar14 = lVar14 + -1;
      lVar15 = lVar15 + -0x20;
    } while (1 < lVar14);
  }
  lVar15 = lVar15 >> 3;
  if (lVar15 == 1) {
LAB_0061a1c8:
    bVar8 = __gnu_cxx::__ops::
            _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
            ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                          *)&local_88,__it);
    _Var17._M_current = __it._M_current;
    if (!bVar8) {
      _Var17._M_current = ppCVar2;
    }
LAB_0061a1dd:
    if (_Var17._M_current != ppCVar2) {
      return false;
    }
  }
  else {
    if (lVar15 == 2) {
LAB_0061a1b0:
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
              ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                            *)&local_88,__it);
      _Var17._M_current = __it._M_current;
      if (!bVar8) {
        __it._M_current = __it._M_current + 1;
        goto LAB_0061a1c8;
      }
      goto LAB_0061a1dd;
    }
    if (lVar15 == 3) {
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
              ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                            *)&local_88,__it);
      _Var17._M_current = __it._M_current;
      if (!bVar8) {
        __it._M_current = __it._M_current + 1;
        goto LAB_0061a1b0;
      }
      goto LAB_0061a1dd;
    }
  }
  __it_00._M_current =
       (callRefs->super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>)._M_impl.
       super__Vector_impl_data._M_start;
  ppCVar3 = (callRefs->super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  lVar15 = (long)ppCVar3 - (long)__it_00._M_current;
  if (0 < lVar15 >> 5) {
    lVar14 = (lVar15 >> 5) + 1;
    do {
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
              ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                            *)&local_88,__it_00);
      _Var18._M_current = __it_00._M_current;
      if (bVar8) goto LAB_0061a2cd;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
              ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                            *)&local_88,
                           (__normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                            )(__it_00._M_current + 1));
      _Var18._M_current = __it_00._M_current + 1;
      if (bVar8) goto LAB_0061a2cd;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
              ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                            *)&local_88,
                           (__normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                            )(__it_00._M_current + 2));
      _Var18._M_current = __it_00._M_current + 2;
      if (bVar8) goto LAB_0061a2cd;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
              ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                            *)&local_88,
                           (__normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                            )(__it_00._M_current + 3));
      _Var18._M_current = __it_00._M_current + 3;
      if (bVar8) goto LAB_0061a2cd;
      __it_00._M_current = __it_00._M_current + 4;
      lVar14 = lVar14 + -1;
      lVar15 = lVar15 + -0x20;
    } while (1 < lVar14);
  }
  lVar15 = lVar15 >> 3;
  if (lVar15 == 1) {
LAB_0061a2b8:
    bVar8 = __gnu_cxx::__ops::
            _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
            ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                          *)&local_88,__it_00);
    _Var18._M_current = __it_00._M_current;
    if (!bVar8) {
      _Var18._M_current = ppCVar3;
    }
  }
  else if (lVar15 == 2) {
LAB_0061a2a0:
    bVar8 = __gnu_cxx::__ops::
            _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
            ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                          *)&local_88,__it_00);
    _Var18._M_current = __it_00._M_current;
    if (!bVar8) {
      __it_00._M_current = __it_00._M_current + 1;
      goto LAB_0061a2b8;
    }
  }
  else {
    if (lVar15 != 3) goto LAB_0061a2d6;
    bVar8 = __gnu_cxx::__ops::
            _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
            ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                          *)&local_88,__it_00);
    _Var18._M_current = __it_00._M_current;
    if (!bVar8) {
      __it_00._M_current = __it_00._M_current + 1;
      goto LAB_0061a2a0;
    }
  }
LAB_0061a2cd:
  if (_Var18._M_current != ppCVar3) {
    return false;
  }
LAB_0061a2d6:
  TVar10 = Function::getLocalType
                     (pFVar1,newIndexes.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._4_4_);
  bVar8 = TypeUpdating::canHandleAsLocal(TVar10);
  if (!bVar8) {
    return false;
  }
  SVar20 = HeapType::getSignature(local_c0);
  local_d8 = SVar20.params.id;
  TVar10.id = wasm::Type::size(&local_d8);
  __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
  __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = &local_d8;
  __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = TVar10.id;
  __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = &local_d8;
  std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
            ((vector<wasm::Type,std::allocator<wasm::Type>> *)local_b0,__first,__last,
             (allocator_type *)auStack_58);
  __src = (pointer)((long)local_b0 +
                   (ulong)newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 8) + 1;
  uVar19 = ((pointer)
           ((long)local_b0 +
           (ulong)newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage._4_4_ * 8))->id;
  if (__src != params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start) {
    memmove((pointer)((long)local_b0 +
                     (ulong)newIndexes.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_ * 8),__src,
            (long)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_start - (long)__src);
  }
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_start = params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start + -1;
  ppFVar9 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  ppFVar16 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar9 == ppFVar16) {
    auStack_58 = (undefined1  [8])0x0;
    newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    do {
      pFVar1 = *ppFVar9;
      Tuple::Tuple((Tuple *)auStack_58,(TypeList *)local_b0);
      wasm::Type::Type((Type *)&runner_local,(Tuple *)auStack_58);
      pPVar7 = runner_local;
      SVar20 = HeapType::getSignature(&pFVar1->type);
      SVar20.params.id = (uintptr_t)pPVar7;
      HeapType::HeapType((HeapType *)&hasBadEffects.index,SVar20);
      (pFVar1->type).id = CONCAT44(hasBadEffects.index._4_4_,(Index)hasBadEffects.index);
      if (auStack_58 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_58,
                        (long)newIndexes.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(pFVar1->localNames)._M_h);
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear(&(pFVar1->localIndices)._M_h);
      ppFVar9 = ppFVar9 + 1;
    } while (ppFVar9 != ppFVar16);
    ppFVar9 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppFVar16 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    auStack_58 = (undefined1  [8])0x0;
    newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (ppFVar9 != ppFVar16) {
      do {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar19;
        hasBadEffects.index._0_4_ =
             Builder::addVar((Builder *)*ppFVar9,(Function *)0x0,(Name)(auVar6 << 0x40),TVar10);
        if (newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,
                     (iterator)
                     newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,(uint *)&hasBadEffects.index);
        }
        else {
          *newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = (Index)hasBadEffects.index;
          newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        ppFVar9 = ppFVar9 + 1;
      } while (ppFVar9 != ppFVar16);
      ppFVar9 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppFVar16 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    if (ppFVar16 != ppFVar9) {
      uVar19 = 0;
      do {
        pFVar1 = ppFVar9[uVar19];
        if ((pFVar1->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          local_1b8.newIndex = *(Index *)((long)(uintptr_t *)auStack_58 + uVar19 * 4);
          local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
          super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.replacep =
               (Expression **)0x0;
          local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
          super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.usedFixed = 0;
          local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
          super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
          super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.currFunction =
               (Function *)0x0;
          local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
          super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
          super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
          super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.currModule = (Module *)0x0;
          local_1b8.removedIndex =
               newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
          Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::pushTask
                    ((Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_> *)&local_1b8,
                     PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::scan,
                     &pFVar1->body);
          while (((long)local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>
                        .super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.
                        flexible.
                        super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>
                        .super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.
                        flexible.
                        super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) +
                 local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                 super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.usedFixed != 0
                ) {
            if (local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
                super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
                super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              if (local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                  super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.usedFixed ==
                  0) {
                __assert_fail("usedFixed > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                              ,0x5a,
                              "T &wasm::SmallVector<wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, 10>::back() [T = wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, N = 10]"
                             );
              }
              p_Var11 = local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>
                        .super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.fixed.
                        _M_elems[local_1b8.
                                 super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                                 super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                                 stack.usedFixed - 1].func;
              local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
              super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.replacep =
                   local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                   super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.fixed.
                   _M_elems[local_1b8.
                            super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                            super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.
                            usedFixed - 1].currp;
              local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
              super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.usedFixed =
                   local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                   super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.usedFixed -
                   1;
            }
            else {
              p_Var11 = local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>
                        .super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.
                        flexible.
                        super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].func;
              local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
              super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.replacep =
                   local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                   super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
                   super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].currp;
              local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
              super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
              super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                   super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
                   super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
            }
            if (*local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                 super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.replacep ==
                (Expression *)0x0) {
              __assert_fail("*task.currp",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                            ,0x139,
                            "void wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::walk(Expression *&) [SubType = LocalUpdater, VisitorType = wasm::Visitor<LocalUpdater>]"
                           );
            }
            (*p_Var11)(&local_1b8,
                       local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                       super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.replacep);
          }
          if (local_1b8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
              super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
              super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1b8.
                            super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                            super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.
                            flexible.
                            super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1b8.
                                  super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>
                                  .super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                                  stack.flexible.
                                  super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1b8.
                                  super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>
                                  .super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                                  stack.flexible.
                                  super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          TypeUpdating::handleNonDefaultableLocals
                    (pFVar1,(Module *)
                            params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
          ppFVar9 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
          ppFVar16 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar19 = (ulong)((int)uVar19 + 1);
      } while (uVar19 < (ulong)((long)ppFVar16 - (long)ppFVar9 >> 3));
    }
  }
  ppCVar4 = (local_b8->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar12 = (local_b8->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>).
                  _M_impl.super__Vector_impl_data._M_start; ppCVar12 != ppCVar4;
      ppCVar12 = ppCVar12 + 1) {
    end_it.parent = &(*ppCVar12)->operands;
    start_it.index._0_4_ =
         newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
    start_it.parent = end_it.parent;
    start_it.index._4_4_ = 0;
    end_it.index = (ulong)newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::erase
              (&(end_it.parent)->
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,start_it,
               end_it);
  }
  ppCVar5 = (callRefs->super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar13 = (callRefs->super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>).
                  _M_impl.super__Vector_impl_data._M_start; ppCVar13 != ppCVar5;
      ppCVar13 = ppCVar13 + 1) {
    end_it_00.parent = &(*ppCVar13)->operands;
    start_it_00.index._0_4_ =
         newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
    start_it_00.parent = end_it_00.parent;
    start_it_00.index._4_4_ = 0;
    end_it_00.index =
         (ulong)newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::erase
              (&(end_it_00.parent)->
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               start_it_00,end_it_00);
  }
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  if (local_b0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_b0,
                    (long)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                          .super__Vector_impl_data._M_finish - (long)local_b0);
  }
  return true;
}

Assistant:

bool removeParameter(const std::vector<Function*>& funcs,
                     Index index,
                     const std::vector<Call*>& calls,
                     const std::vector<CallRef*>& callRefs,
                     Module* module,
                     PassRunner* runner) {
  assert(funcs.size() > 0);
  auto* first = funcs[0];
#ifndef NDEBUG
  for (auto* func : funcs) {
    assert(func->type == first->type);
  }
#endif

  // Check if none of the calls has a param with side effects that we cannot
  // remove (as if we can remove them, we will simply do that when we remove the
  // parameter). Note: flattening the IR beforehand can help here.
  //
  // It would also be bad if we remove a parameter that causes the type of the
  // call to change, like this:
  //
  //  (call $foo
  //    (unreachable))
  //
  // After removing the parameter the type should change from unreachable to
  // something concrete. We could handle this by updating the type and then
  // propagating that out, or by appending an unreachable after the call, but
  // for simplicity just ignore such cases; if we are called again later then
  // if DCE ran meanwhile then we could optimize.
  auto hasBadEffects = [&](auto* call) {
    auto& operands = call->operands;
    bool hasUnremovable =
      EffectAnalyzer(runner->options, *module, operands[index])
        .hasUnremovableSideEffects();
    bool wouldChangeType = call->type == Type::unreachable && !call->isReturn &&
                           operands[index]->type == Type::unreachable;
    return hasUnremovable || wouldChangeType;
  };
  bool callParamsAreValid =
    std::none_of(calls.begin(), calls.end(), [&](Call* call) {
      return hasBadEffects(call);
    });
  if (!callParamsAreValid) {
    return false;
  }
  bool callRefParamsAreValid =
    std::none_of(callRefs.begin(), callRefs.end(), [&](CallRef* call) {
      return hasBadEffects(call);
    });
  if (!callRefParamsAreValid) {
    return false;
  }

  // The type must be valid for us to handle as a local (since we
  // replace the parameter with a local).
  // TODO: if there are no references at all, we can avoid creating a
  //       local
  bool typeIsValid = TypeUpdating::canHandleAsLocal(first->getLocalType(index));
  if (!typeIsValid) {
    return false;
  }

  // We can do it!

  // Remove the parameter from the function. We must add a new local
  // for uses of the parameter, but cannot make it use the same index
  // (in general).
  auto paramsType = first->getParams();
  std::vector<Type> params(paramsType.begin(), paramsType.end());
  auto type = params[index];
  params.erase(params.begin() + index);
  // TODO: parallelize some of these loops?
  for (auto* func : funcs) {
    func->setParams(Type(params));

    // It's cumbersome to adjust local names - TODO don't clear them?
    Builder::clearLocalNames(func);
  }
  std::vector<Index> newIndexes;
  for (auto* func : funcs) {
    newIndexes.push_back(Builder::addVar(func, type));
  }
  // Update local operations.
  struct LocalUpdater : public PostWalker<LocalUpdater> {
    Index removedIndex;
    Index newIndex;
    LocalUpdater(Function* func, Index removedIndex, Index newIndex)
      : removedIndex(removedIndex), newIndex(newIndex) {
      walk(func->body);
    }
    void visitLocalGet(LocalGet* curr) { updateIndex(curr->index); }
    void visitLocalSet(LocalSet* curr) { updateIndex(curr->index); }
    void updateIndex(Index& index) {
      if (index == removedIndex) {
        index = newIndex;
      } else if (index > removedIndex) {
        index--;
      }
    }
  };
  for (Index i = 0; i < funcs.size(); i++) {
    auto* func = funcs[i];
    if (!func->imported()) {
      LocalUpdater(funcs[i], index, newIndexes[i]);
      TypeUpdating::handleNonDefaultableLocals(func, *module);
    }
  }

  // Remove the arguments from the calls.
  for (auto* call : calls) {
    call->operands.erase(call->operands.begin() + index);
  }
  for (auto* call : callRefs) {
    call->operands.erase(call->operands.begin() + index);
  }

  return true;
}